

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_send_text_frame_no_handler(void)

{
  cio_error cVar1;
  char data [5];
  cio_write_buffer wb;
  cio_write_buffer local_20;
  
  wb.data.head.q_len = (size_t)data;
  builtin_strncpy(data,"aaaaa",5);
  local_20.next = &wb;
  wb.data.element.length = 5;
  wb.next = &local_20;
  local_20.data.head.q_len = 1;
  local_20.data.element.length = 5;
  wb.prev = wb.next;
  local_20.prev = local_20.next;
  cVar1 = cio_websocket_write_message_first_chunk
                    (ws,5,wb.next,true,false,(cio_websocket_write_handler_t)0x0,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a text frame with no handler did not fail!",0xac6,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_send_text_frame_no_handler(void)
{
	char data[5];
	memset(data, 'a', sizeof(data));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, NULL, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a text frame with no handler did not fail!");
}